

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::
     ExpectLastRepeatedExtensionsRemovedPacked<proto2_unittest::TestPackedExtensions>
               (TestPackedExtensions *message)

{
  ConstType_conflict2 CVar1;
  ConstType CVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_58;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  gtest_ar_._0_4_ = 1;
  local_58.data_._0_4_ =
       (ConstType_conflict4)
       proto2_unittest::TestPackedExtensions::
       ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                 (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                           *)&proto2_unittest::packed_int32_extension);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","message.ExtensionSize(Traits::packed_int32_extension)",
             (int *)&gtest_ar_,(int *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xeea,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_._0_4_ = 1;
    local_58.data_._0_4_ =
         (ConstType_conflict4)
         proto2_unittest::TestPackedExtensions::
         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                   (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                             *)proto2_unittest::packed_int64_extension);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","message.ExtensionSize(Traits::packed_int64_extension)",
               (int *)&gtest_ar_,(int *)&local_58);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xeeb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_._0_4_ = 1;
      local_58.data_._0_4_ =
           (ConstType_conflict4)
           proto2_unittest::TestPackedExtensions::
           ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                     (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                               *)&proto2_unittest::packed_uint32_extension);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"1","message.ExtensionSize(Traits::packed_uint32_extension)",
                 (int *)&gtest_ar_,(int *)&local_58);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar3 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0xeec,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_._0_4_ = 1;
        local_58.data_._0_4_ =
             (ConstType_conflict4)
             proto2_unittest::TestPackedExtensions::
             ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                       (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                 *)proto2_unittest::packed_uint64_extension);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"1",
                   "message.ExtensionSize(Traits::packed_uint64_extension)",(int *)&gtest_ar_,
                   (int *)&local_58);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar3 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar3 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0xeed,pcVar3);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_._0_4_ = 1;
          local_58.data_._0_4_ =
               (ConstType_conflict4)
               proto2_unittest::TestPackedExtensions::
               ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                         (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                   *)&proto2_unittest::packed_sint32_extension);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"1",
                     "message.ExtensionSize(Traits::packed_sint32_extension)",(int *)&gtest_ar_,
                     (int *)&local_58);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = anon_var_dwarf_651463 + 5;
            }
            else {
              pcVar3 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0xeee,pcVar3);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar_._0_4_ = 1;
            local_58.data_._0_4_ =
                 (ConstType_conflict4)
                 proto2_unittest::TestPackedExtensions::
                 ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                           (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                     *)proto2_unittest::packed_sint64_extension);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"1",
                       "message.ExtensionSize(Traits::packed_sint64_extension)",(int *)&gtest_ar_,
                       (int *)&local_58);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar3 = anon_var_dwarf_651463 + 5;
              }
              else {
                pcVar3 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0xeef,pcVar3);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              gtest_ar_._0_4_ = 1;
              local_58.data_._0_4_ =
                   (ConstType_conflict4)
                   proto2_unittest::TestPackedExtensions::
                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                             (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                       *)&proto2_unittest::packed_fixed32_extension);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"1",
                         "message.ExtensionSize(Traits::packed_fixed32_extension)",(int *)&gtest_ar_
                         ,(int *)&local_58);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar3 = anon_var_dwarf_651463 + 5;
                }
                else {
                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_58,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0xef0,pcVar3);
                testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                gtest_ar_._0_4_ = 1;
                local_58.data_._0_4_ =
                     (ConstType_conflict4)
                     proto2_unittest::TestPackedExtensions::
                     ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                               (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                         *)proto2_unittest::packed_fixed64_extension);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"1",
                           "message.ExtensionSize(Traits::packed_fixed64_extension)",
                           (int *)&gtest_ar_,(int *)&local_58);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar3 = anon_var_dwarf_651463 + 5;
                  }
                  else {
                    pcVar3 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0xef1,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  gtest_ar_._0_4_ = 1;
                  local_58.data_._0_4_ =
                       (ConstType_conflict4)
                       proto2_unittest::TestPackedExtensions::
                       ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                                 (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                           *)&proto2_unittest::packed_sfixed32_extension);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"1",
                             "message.ExtensionSize(Traits::packed_sfixed32_extension)",
                             (int *)&gtest_ar_,(int *)&local_58);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar3 = anon_var_dwarf_651463 + 5;
                    }
                    else {
                      pcVar3 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_58,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0xef2,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar.message_);
                    gtest_ar_._0_4_ = 1;
                    local_58.data_._0_4_ =
                         (ConstType_conflict4)
                         proto2_unittest::TestPackedExtensions::
                         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                                   (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                             *)proto2_unittest::packed_sfixed64_extension);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"1",
                               "message.ExtensionSize(Traits::packed_sfixed64_extension)",
                               (int *)&gtest_ar_,(int *)&local_58);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar_);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        pcVar3 = anon_var_dwarf_651463 + 5;
                      }
                      else {
                        pcVar3 = *(char **)gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_58,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0xef3,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar.message_);
                      gtest_ar_._0_4_ = 1;
                      local_58.data_._0_4_ =
                           (ConstType_conflict4)
                           proto2_unittest::TestPackedExtensions::
                           ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>>
                                     (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                               *)&proto2_unittest::packed_float_extension);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"1",
                                 "message.ExtensionSize(Traits::packed_float_extension)",
                                 (int *)&gtest_ar_,(int *)&local_58);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar3 = anon_var_dwarf_651463 + 5;
                        }
                        else {
                          pcVar3 = *(char **)gtest_ar.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_58,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0xef4,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar_);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar.message_);
                        gtest_ar_._0_4_ = 1;
                        local_58.data_._0_4_ =
                             (ConstType_conflict4)
                             proto2_unittest::TestPackedExtensions::
                             ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>>
                                       (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                 *)proto2_unittest::packed_double_extension);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"1",
                                   "message.ExtensionSize(Traits::packed_double_extension)",
                                   (int *)&gtest_ar_,(int *)&local_58);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&gtest_ar_);
                          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl ==
                              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                            pcVar3 = anon_var_dwarf_651463 + 5;
                          }
                          else {
                            pcVar3 = *(char **)gtest_ar.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_58,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0xef5,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    (&local_58,(Message *)&gtest_ar_);
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          gtest_ar_._0_4_ = 1;
                          local_58.data_._0_4_ =
                               (ConstType_conflict4)
                               proto2_unittest::TestPackedExtensions::
                               ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>>
                                         (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"1",
                                     "message.ExtensionSize(Traits::packed_bool_extension)",
                                     (int *)&gtest_ar_,(int *)&local_58);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar3 = anon_var_dwarf_651463 + 5;
                            }
                            else {
                              pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_58,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0xef6,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_58,(Message *)&gtest_ar_);
                          }
                          else {
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr(&gtest_ar.message_);
                            gtest_ar_._0_4_ = 1;
                            local_58.data_._0_4_ =
                                 (ConstType_conflict4)
                                 proto2_unittest::TestPackedExtensions::
                                 ExtensionSize<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,(unsigned_char)14,true,google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>>
                                           (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"1",
                                       "message.ExtensionSize(Traits::packed_enum_extension)",
                                       (int *)&gtest_ar_,(int *)&local_58);
                            if (gtest_ar.success_ != false) {
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_._0_4_ = 0x259;
                              local_58.data_._0_4_ =
                                   (ConstType_conflict4)
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                                                  *)&proto2_unittest::packed_int32_extension,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"601",
                                         "message.GetExtension(Traits::packed_int32_extension, 0)",
                                         (int *)&gtest_ar_,(int *)&local_58);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefa,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              local_58.data_._0_4_ = 8.43582e-43;
                              gtest_ar_._0_8_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                                                  *)proto2_unittest::packed_int64_extension,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)&gtest_ar,"602",
                                         "message.GetExtension(Traits::packed_int64_extension, 0)",
                                         (int *)&local_58,(long *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefb,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_._0_4_ = 0x25b;
                              local_58.data_._0_4_ =
                                   (ConstType_conflict4)
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                                                  *)&proto2_unittest::packed_uint32_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)&gtest_ar,"603",
                                         "message.GetExtension(Traits::packed_uint32_extension, 0)",
                                         (int *)&gtest_ar_,(uint *)&local_58);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefc,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              local_58.data_._0_4_ = 8.46384e-43;
                              gtest_ar_._0_8_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                                  *)proto2_unittest::packed_uint64_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)&gtest_ar,"604",
                                         "message.GetExtension(Traits::packed_uint64_extension, 0)",
                                         (int *)&local_58,(unsigned_long *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefd,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_._0_4_ = 0x25d;
                              local_58.data_._0_4_ =
                                   (ConstType_conflict4)
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                                  *)&proto2_unittest::packed_sint32_extension,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"605",
                                         "message.GetExtension(Traits::packed_sint32_extension, 0)",
                                         (int *)&gtest_ar_,(int *)&local_58);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefe,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              local_58.data_._0_4_ = 8.49187e-43;
                              gtest_ar_._0_8_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                                  *)proto2_unittest::packed_sint64_extension,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)&gtest_ar,"606",
                                         "message.GetExtension(Traits::packed_sint64_extension, 0)",
                                         (int *)&local_58,(long *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xeff,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_._0_4_ = 0x25f;
                              local_58.data_._0_4_ =
                                   (ConstType_conflict4)
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                                  *)&proto2_unittest::packed_fixed32_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)&gtest_ar,"607",
                                         "message.GetExtension(Traits::packed_fixed32_extension, 0)"
                                         ,(int *)&gtest_ar_,(uint *)&local_58);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf00,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              local_58.data_._0_4_ = 8.51989e-43;
                              gtest_ar_._0_8_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                                  *)proto2_unittest::packed_fixed64_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)&gtest_ar,"608",
                                         "message.GetExtension(Traits::packed_fixed64_extension, 0)"
                                         ,(int *)&local_58,(unsigned_long *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf01,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_._0_4_ = 0x261;
                              local_58.data_._0_4_ =
                                   (ConstType_conflict4)
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                                  *)&proto2_unittest::packed_sfixed32_extension,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"609",
                                         "message.GetExtension(Traits::packed_sfixed32_extension, 0)"
                                         ,(int *)&gtest_ar_,(int *)&local_58);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf02,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              local_58.data_._0_4_ = 8.54792e-43;
                              gtest_ar_._0_8_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                                  *)proto2_unittest::packed_sfixed64_extension,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)&gtest_ar,"610",
                                         "message.GetExtension(Traits::packed_sfixed64_extension, 0)"
                                         ,(int *)&local_58,(long *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf03,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_._0_4_ = 0x263;
                              local_58.data_._0_4_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                                  *)&proto2_unittest::packed_float_extension,0);
                              testing::internal::CmpHelperEQ<int,float>
                                        ((internal *)&gtest_ar,"611",
                                         "message.GetExtension(Traits::packed_float_extension, 0)",
                                         (int *)&gtest_ar_,(float *)&local_58);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf04,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              local_58.data_._0_4_ = 8.57595e-43;
                              gtest_ar_._0_8_ =
                                   proto2_unittest::TestPackedExtensions::
                                   GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true,_0>
                                             (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                  *)proto2_unittest::packed_double_extension,0);
                              testing::internal::CmpHelperEQ<int,double>
                                        ((internal *)&gtest_ar,"612",
                                         "message.GetExtension(Traits::packed_double_extension, 0)",
                                         (int *)&local_58,(double *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf05,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              CVar1 = proto2_unittest::TestPackedExtensions::
                                      GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true,_0>
                                                (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension,0);
                              gtest_ar_.success_ = CVar1;
                              gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )0x0;
                              if (!CVar1) {
                                testing::Message::Message((Message *)&local_58);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                           (AssertionResult *)
                                           "message.GetExtension(Traits::packed_bool_extension, 0)",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf06,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_)
                                          );
                                testing::internal::AssertHelper::operator=
                                          (&local_20,(Message *)&local_58);
                                testing::internal::AssertHelper::~AssertHelper(&local_20);
                                std::__cxx11::string::~string((string *)&gtest_ar);
                                if ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) !=
                                    (long *)0x0) {
                                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,
                                                                 local_58.data_._0_4_) + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar_.message_);
                              CVar2 = proto2_unittest::TestPackedExtensions::
                                      GetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_true,_0>
                                                (message,(
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension,0);
                              gtest_ar_._0_4_ = CVar2;
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
                                        ((internal *)&gtest_ar,"Traits::FOREIGN_BAR",
                                         "message.GetExtension(Traits::packed_enum_extension, 0)",
                                         &TestUtilTraits<proto2_unittest::TestAllExtensions>::
                                          FOREIGN_BAR,(ForeignEnum *)&gtest_ar_);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar3 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf08,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_58,(Message *)&gtest_ar_);
                                testing::internal::AssertHelper::~AssertHelper(&local_58);
                                if (gtest_ar_._0_8_ != 0) {
                                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                                }
                              }
                              goto LAB_005bf772;
                            }
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar3 = anon_var_dwarf_651463 + 5;
                            }
                            else {
                              pcVar3 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_58,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0xef7,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_58,(Message *)&gtest_ar_);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (gtest_ar_._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
  }
LAB_005bf772:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void ExpectLastRepeatedExtensionsRemovedPacked(
    const TestPackedExtensions& message) {
  using Traits = TestUtilTraits<TestPackedExtensions>;
  // Test that one element was removed.
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_int32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_int64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_uint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_uint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_fixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_fixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sfixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sfixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_float_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_double_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_bool_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_enum_extension));

  // Test that the remaining element is the correct one.
  EXPECT_EQ(601, message.GetExtension(Traits::packed_int32_extension, 0));
  EXPECT_EQ(602, message.GetExtension(Traits::packed_int64_extension, 0));
  EXPECT_EQ(603, message.GetExtension(Traits::packed_uint32_extension, 0));
  EXPECT_EQ(604, message.GetExtension(Traits::packed_uint64_extension, 0));
  EXPECT_EQ(605, message.GetExtension(Traits::packed_sint32_extension, 0));
  EXPECT_EQ(606, message.GetExtension(Traits::packed_sint64_extension, 0));
  EXPECT_EQ(607, message.GetExtension(Traits::packed_fixed32_extension, 0));
  EXPECT_EQ(608, message.GetExtension(Traits::packed_fixed64_extension, 0));
  EXPECT_EQ(609, message.GetExtension(Traits::packed_sfixed32_extension, 0));
  EXPECT_EQ(610, message.GetExtension(Traits::packed_sfixed64_extension, 0));
  EXPECT_EQ(611, message.GetExtension(Traits::packed_float_extension, 0));
  EXPECT_EQ(612, message.GetExtension(Traits::packed_double_extension, 0));
  EXPECT_TRUE(message.GetExtension(Traits::packed_bool_extension, 0));
  EXPECT_EQ(Traits::FOREIGN_BAR,
            message.GetExtension(Traits::packed_enum_extension, 0));
}